

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O2

bool __thiscall
QTransposeProxyModel::moveColumns
          (QTransposeProxyModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  QAbstractItemModel *pQVar1;
  undefined1 uVar2;
  parameter_type pQVar4;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  long in_FS_OFFSET;
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  long local_38;
  int iVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(*(long *)(this + 8) + 0xd8);
  pQVar4 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(this_00);
  if (pQVar4 == (parameter_type)0x0) {
    uVar2 = 0;
  }
  else {
    QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
    ::value(this_00);
    pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
    (**(code **)(*(long *)this + 400))(local_50,this,sourceParent);
    (**(code **)(*(long *)this + 400))(local_68,this,destinationParent);
    iVar3 = (*(pQVar1->super_QObject)._vptr_QObject[0x23])
                      (pQVar1,local_50,(ulong)(uint)sourceRow,(ulong)(uint)count,local_68,
                       (ulong)(uint)destinationChild);
    uVar2 = (undefined1)iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTransposeProxyModel::moveColumns(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    Q_D(QTransposeProxyModel);
    Q_ASSERT(checkIndex(sourceParent));
    Q_ASSERT(checkIndex(destinationParent));
    if (!d->model)
        return false;
    return d->model->moveRows(mapToSource(sourceParent), sourceRow, count, mapToSource(destinationParent), destinationChild);
}